

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamreader.cpp
# Opt level: O3

qsizetype __thiscall
QCborStreamReaderPrivate::readStringChunk_unicode
          (QCborStreamReaderPrivate *this,ReadStringChunk params,qsizetype utf8len)

{
  long lVar1;
  char16_t *pcVar2;
  bool bVar3;
  char16_t *pcVar4;
  char16_t *pcVar5;
  QUtf8 *this_00;
  State *__nbytes;
  __off_t extraout_RDX;
  __off_t extraout_RDX_00;
  __off_t __length;
  __off_t extraout_RDX_03;
  size_t allocSize;
  char16_t *allocSize_00;
  anon_union_8_3_4d1d901a_for_ReadStringChunk_0 this_01;
  long size;
  State *in_R8;
  qsizetype qVar6;
  char16_t *buffer;
  char *__file;
  long in_FS_OFFSET;
  QByteArrayView in;
  QByteArrayView in_00;
  State local_1b0;
  char16_t *local_180;
  char16_t *local_178;
  undefined1 *local_170;
  undefined1 local_168 [256];
  State local_68;
  long local_38;
  __off_t extraout_RDX_01;
  __off_t extraout_RDX_02;
  
  this_01 = params.field_0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = ((DataPointer *)&(this_01.array)->d)->size;
  size = lVar1 + utf8len;
  __nbytes = (State *)CONCAT71((int7)((ulong)utf8len >> 8),-1 < size);
  if (utf8len < 0x3ffffffffffffff7 && -1 < size) {
    QString::resize(this_01.string,size);
    pcVar2 = ((DataPointer *)&(this_01.array)->d)->ptr;
    this_00 = (QUtf8 *)(pcVar2 + lVar1);
    local_68.flags.super_QFlagsStorageHelper<QStringConverterBase::Flag,_4>.
    super_QFlagsStorage<QStringConverterBase::Flag>.i =
         (QFlagsStorageHelper<QStringConverterBase::Flag,_4>)
         (QFlagsStorage<QStringConverterBase::Flag>)0x1;
    local_68.internalState = 0;
    local_68.remainingChars._0_4_ = 0;
    local_68.remainingChars._4_4_ = 0;
    local_68.invalidChars._0_4_ = 0;
    local_68.invalidChars._4_4_ = 0;
    local_68.field_4.state_data[0] = 0;
    local_68.field_4.state_data[1] = 0;
    local_68.field_4.state_data[2] = 0;
    local_68.field_4.state_data[3] = 0;
    local_68.clearFn = (ClearDataFn)0x0;
    if (this->device == (QIODevice *)0x0) {
      in_00.m_size = (this->buffer).d.ptr + this->bufferStart;
      in_00.m_data = (storage_type *)&local_68;
      this_00 = (QUtf8 *)QUtf8::convertToUnicode(this_00,(char16_t *)utf8len,in_00,in_R8);
      __length = extraout_RDX_02;
LAB_0049d6ee:
      if (CONCAT44(local_68.remainingChars._4_4_,(undefined4)local_68.remainingChars) == 0 &&
          CONCAT44(local_68.invalidChars._4_4_,(undefined4)local_68.invalidChars) == 0) {
        __file = (char *)((long)this_00 - (long)pcVar2 >> 1);
        QString::truncate(this_01.string,__file,__length);
        qVar6 = (long)__file - lVar1;
      }
      else {
        this->corrupt = true;
        (this->lastError).c = InvalidUtf8String;
        qVar6 = -1;
      }
    }
    else {
      allocSize_00 = (char16_t *)0x4000;
      if (utf8len < 0x4000) {
        allocSize_00 = (char16_t *)utf8len;
      }
      memset(local_168,0xaa,0x100);
      local_180 = (char16_t *)0x100;
      local_178 = (char16_t *)0x0;
      local_170 = local_168;
      if (0x100 < utf8len) {
        local_180 = allocSize_00;
        pcVar4 = (char16_t *)QtPrivate::expectedAllocSize((size_t)allocSize_00,0x10);
        if (pcVar4 == (char16_t *)0x0) {
          pcVar4 = allocSize_00;
        }
        local_170 = (undefined1 *)malloc((size_t)pcVar4);
        local_180 = pcVar4;
        if (local_170 == (undefined1 *)0x0) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            qBadAlloc();
          }
          goto LAB_0049d806;
        }
      }
      local_1b0.flags.super_QFlagsStorageHelper<QStringConverterBase::Flag,_4>.
      super_QFlagsStorage<QStringConverterBase::Flag>.i =
           (QFlagsStorageHelper<QStringConverterBase::Flag,_4>)
           (QFlagsStorage<QStringConverterBase::Flag>)0x8;
      local_1b0._4_8_ = 0;
      local_1b0._12_8_ = 0;
      local_1b0.invalidChars._4_4_ = 0;
      local_1b0.field_4.state_data[0] = 0;
      local_1b0.field_4.state_data[1] = 0;
      local_1b0.field_4.state_data[2] = 0;
      local_1b0.field_4.state_data[3] = 0;
      local_1b0.clearFn = (ClearDataFn)0x0;
      local_178 = allocSize_00;
      QStringConverterBase::State::clear(&local_68);
      local_68.flags.super_QFlagsStorageHelper<QStringConverterBase::Flag,_4>.
      super_QFlagsStorage<QStringConverterBase::Flag>.i =
           (QFlagsStorageHelper<QStringConverterBase::Flag,_4>)
           (QFlagsStorage<QStringConverterBase::Flag>)0x8;
      local_68.remainingChars._0_4_ = 0;
      local_68.remainingChars._4_4_ = 0;
      local_68.invalidChars._0_4_ = 0;
      local_68.invalidChars._4_4_ = 0;
      local_68.field_4.state_data[0] = local_1b0.field_4.state_data[0];
      local_68.field_4.state_data[1] = local_1b0.field_4.state_data[1];
      local_68.field_4.state_data[2] = local_1b0.field_4.state_data[2];
      local_68.field_4.state_data[3] = local_1b0.field_4.state_data[3];
      local_68.clearFn = (ClearDataFn)0x0;
      local_1b0.clearFn = (ClearDataFn)0x0;
      QStringConverterBase::State::clear(&local_1b0);
      if ((utf8len < 1) ||
         (CONCAT44(local_68.invalidChars._4_4_,(undefined4)local_68.invalidChars) != 0)) {
        bVar3 = true;
        __length = extraout_RDX;
      }
      else {
        bVar3 = true;
        while( true ) {
          pcVar4 = (char16_t *)utf8len;
          if ((long)allocSize_00 < utf8len) {
            pcVar4 = allocSize_00;
          }
          pcVar5 = (char16_t *)QIODevice::read(this->device,(int)local_170,pcVar4,(size_t)__nbytes);
          if (pcVar5 != pcVar4) break;
          in.m_data = (storage_type *)&local_68;
          in.m_size = (qsizetype)local_170;
          __nbytes = &local_68;
          this_00 = (QUtf8 *)QUtf8::convertToUnicode(this_00,pcVar4,in,in_R8);
          __length = extraout_RDX_01;
          if (((char16_t *)(utf8len - (long)pcVar4) == (char16_t *)0x0 || utf8len < (long)pcVar4) ||
             (utf8len = utf8len - (long)pcVar4,
             CONCAT44(local_68.invalidChars._4_4_,(undefined4)local_68.invalidChars) != 0))
          goto LAB_0049d6b8;
        }
        this->corrupt = true;
        (this->lastError).c = InputOutputError;
        bVar3 = false;
        __length = extraout_RDX_00;
      }
LAB_0049d6b8:
      if (local_170 != local_168) {
        QtPrivate::sizedFree(local_170,(size_t)local_180);
        __length = extraout_RDX_03;
      }
      qVar6 = -1;
      if (bVar3) goto LAB_0049d6ee;
    }
    QStringConverterBase::State::clear(&local_68);
  }
  else {
    this->corrupt = true;
    (this->lastError).c = DataTooLarge;
    qVar6 = -1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return qVar6;
  }
LAB_0049d806:
  __stack_chk_fail();
}

Assistant:

inline qsizetype
QCborStreamReaderPrivate::readStringChunk_unicode(ReadStringChunk params, qsizetype utf8len)
{
    Q_ASSERT(params.isString());

    // See QUtf8::convertToUnicode() a detailed explanation of why this
    // conversion uses the same number of words or less.
    qsizetype currentSize = params.string->size();
    size_t newSize = size_t(utf8len) + size_t(currentSize); // can't overflow
    if (utf8len > QString::maxSize() || qsizetype(newSize) < 0) {
        handleError(CborErrorDataTooLarge);
        return -1;
    }
    QT_TRY {
        params.string->resize(qsizetype(newSize));
    }